

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O2

int inver_order(int *list,int n)

{
  int iVar1;
  long lVar2;
  int j;
  long lVar3;
  
  iVar1 = 0;
  for (lVar2 = 1; lVar2 < n; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      iVar1 = iVar1 + (uint)(list[lVar2] < list[lVar3]);
    }
  }
  return iVar1;
}

Assistant:

int inver_order(int list[], int n) {
    int ret = 0;
    for (int i = 1; i < n; i++)
        for (int j = 0; j < i; j++)
            if (list[j] > list[i])
                ret++;
    return ret;
}